

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O3

vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> * __thiscall
dg::vr::ValueRelations::getDirectlyRelated
          (vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *__return_storage_ptr__
          ,ValueRelations *this,V val,Relations *rels)

{
  _Rb_tree_header *p_Var1;
  pointer *pppVVar2;
  iterator __position;
  _Base_ptr p_Var3;
  const_iterator cVar4;
  _Base_ptr p_Var5;
  RelationsMap related;
  key_type local_60;
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  local_58;
  
  p_Var5 = (this->valToBucket)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var1 = &(this->valToBucket)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      if (*(V *)(p_Var5 + 1) >= val) {
        p_Var3 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(V *)(p_Var5 + 1) < val];
    } while (p_Var5 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var3 != p_Var1) && (*(V *)(p_Var3 + 1) <= val)) &&
       ((Bucket *)p_Var3[1]._M_parent != (Bucket *)0x0)) {
      RelationsGraph<dg::vr::ValueRelations>::getRelated
                ((RelationsMap *)&local_58,&this->graph,(Bucket *)p_Var3[1]._M_parent,rels,true);
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p_Var1 = &local_58._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)local_58._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
        p_Var5 = local_58._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          local_60._M_data = *(Bucket **)(p_Var5 + 1);
          cVar4 = std::
                  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
                  ::find(&(this->bucketToVals)._M_t,&local_60);
          local_60._M_data = *(Bucket **)cVar4._M_node[1]._M_parent;
          __position._M_current =
               (__return_storage_ptr__->
               super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
            _M_realloc_insert<llvm::Value_const*>
                      ((vector<llvm::Value_const*,std::allocator<llvm::Value_const*>> *)
                       __return_storage_ptr__,__position,(Value **)&local_60);
          }
          else {
            *__position._M_current = (Value *)local_60._M_data;
            pppVVar2 = &(__return_storage_ptr__->
                        super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            *pppVVar2 = *pppVVar2 + 1;
          }
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
        } while ((_Rb_tree_header *)p_Var5 != p_Var1);
      }
      std::
      _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
      ::_M_erase(&local_58,(_Link_type)local_58._M_impl.super__Rb_tree_header._M_header._M_parent);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::vector<ValueRelations::V>
ValueRelations::getDirectlyRelated(V val, const Relations &rels) const {
    HandlePtr mH = maybeGet(val);
    if (!mH)
        return {};
    RelationsMap related = graph.getRelated(*mH, rels, true);

    std::vector<ValueRelations::V> result;
    std::transform(related.begin(), related.end(), std::back_inserter(result),
                   [this](const RelationsMap::value_type &pair) {
                       return this->getAny(pair.first);
                   });
    return result;
}